

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

int chacha_test(uint8_t *input_buffer)

{
  uint uVar1;
  int iVar2;
  uint8_t *out_00;
  long in_RDI;
  int res;
  size_t i;
  uint8_t *out_unaligned;
  uint8_t *out_aligned;
  uint8_t *in_unaligned;
  uint8_t *in_aligned;
  uint8_t final_hchacha [32];
  uint8_t out [2056];
  uint8_t h_iv [16];
  uint8_t h_key [32];
  chacha_iv iv;
  chacha_key key;
  size_t in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff738;
  uint uVar3;
  ulong uVar4;
  uint8_t *key_00;
  undefined1 local_898 [80];
  uint8_t *in_stack_fffffffffffff7b8;
  uint8_t *in_stack_fffffffffffff7c0;
  chacha_iv *in_stack_fffffffffffff7c8;
  chacha_key *in_stack_fffffffffffff7d0;
  uint8_t *in_stack_fffffffffffff7f8;
  uint8_t *in_stack_fffffffffffff800;
  chacha_iv *in_stack_fffffffffffff808;
  chacha_key *in_stack_fffffffffffff810;
  uint8_t *in_stack_fffffffffffff828;
  uint8_t *in_stack_fffffffffffff830;
  chacha_iv *in_stack_fffffffffffff838;
  chacha_key *in_stack_fffffffffffff840;
  uint8_t local_68 [16];
  char local_58 [40];
  char local_30 [8];
  char local_28 [32];
  long local_8;
  
  uVar3 = 1;
  for (uVar4 = 0; uVar4 < 0x20; uVar4 = uVar4 + 1) {
    local_28[uVar4] = (char)uVar4 + ' ';
  }
  for (uVar4 = 0; uVar4 < 8; uVar4 = uVar4 + 1) {
    local_30[uVar4] = (char)uVar4 + -0x80;
  }
  if (in_RDI == 0) {
    out_00 = (uint8_t *)0x0;
  }
  else {
    out_00 = (uint8_t *)(in_RDI + 1);
  }
  local_8 = in_RDI;
  uVar1 = chacha_test_oneblock
                    (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                     in_stack_fffffffffffff7b8);
  uVar1 = uVar1 & uVar3;
  uVar3 = chacha_test_oneblock
                    (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                     in_stack_fffffffffffff7b8);
  uVar3 = uVar3 & uVar1;
  if (local_8 != 0) {
    uVar1 = chacha_test_oneblock
                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
                       ,in_stack_fffffffffffff7b8);
    uVar1 = uVar1 & uVar3;
    uVar3 = chacha_test_oneblock
                      (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
                       ,in_stack_fffffffffffff7b8);
    uVar3 = uVar3 & uVar1;
  }
  uVar1 = chacha_test_multiblock
                    (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800,
                     in_stack_fffffffffffff7f8);
  uVar1 = uVar1 & uVar3;
  uVar3 = chacha_test_multiblock
                    (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800,
                     in_stack_fffffffffffff7f8);
  uVar3 = uVar3 & uVar1;
  if (local_8 != 0) {
    uVar1 = chacha_test_multiblock
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800
                       ,in_stack_fffffffffffff7f8);
    uVar1 = uVar1 & uVar3;
    uVar3 = chacha_test_multiblock
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,in_stack_fffffffffffff800
                       ,in_stack_fffffffffffff7f8);
    uVar3 = uVar3 & uVar1;
  }
  uVar1 = chacha_test_multiblock_incremental
                    (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                     in_stack_fffffffffffff828);
  uVar1 = uVar1 & uVar3;
  uVar3 = chacha_test_multiblock_incremental
                    (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830,
                     in_stack_fffffffffffff828);
  uVar3 = uVar3 & uVar1;
  if (local_8 != 0) {
    uVar1 = chacha_test_multiblock_incremental
                      (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830
                       ,in_stack_fffffffffffff828);
    uVar1 = uVar1 & uVar3;
    uVar3 = chacha_test_multiblock_incremental
                      (in_stack_fffffffffffff840,in_stack_fffffffffffff838,in_stack_fffffffffffff830
                       ,in_stack_fffffffffffff828);
    uVar3 = uVar3 & uVar1;
  }
  for (uVar4 = 0; uVar4 < 0x20; uVar4 = uVar4 + 1) {
    local_58[uVar4] = (char)uVar4 + -0x40;
  }
  for (key_00 = (uint8_t *)0x0; key_00 < (uint8_t *)0x10; key_00 = key_00 + 1) {
    local_68[(long)key_00] = (char)key_00 + '\x10';
  }
  memset(local_898,0,0x20);
  hchacha(key_00,(uint8_t *)CONCAT44(uVar3,in_stack_fffffffffffff738),out_00,
          in_stack_fffffffffffff728);
  iVar2 = memcmp(expected_hchacha,local_898,0x20);
  return iVar2 == 0 & uVar3;
}

Assistant:

static int
chacha_test(const uint8_t *input_buffer) {
    chacha_key key;
    chacha_iv iv;
    uint8_t h_key[32];
    uint8_t h_iv[16];
    uint8_t out[CHACHA_TEST_LEN+sizeof(size_t)], final_hchacha[32];
    const uint8_t *in_aligned, *in_unaligned;
    uint8_t *out_aligned, *out_unaligned;
    size_t i;
    int res = 1;

    /*
        key [32,33,34,..63], iv [128,129,130,131,132,133,134,135]
    */
    for (i = 0; i < sizeof(key); i++) key.b[i] = (uint8_t)(i + 32);
    for (i = 0; i < sizeof(iv); i++) iv.b[i] = (uint8_t)(i + 128);

    in_aligned = input_buffer;
    in_unaligned = (input_buffer) ? (input_buffer + 1) : NULL;
    out_aligned = out;
    out_unaligned = out + 1;

    /* single block */
    res &= chacha_test_oneblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_oneblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_oneblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_oneblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* multi */
    res &= chacha_test_multiblock(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock(&key, &iv, in_unaligned, out_unaligned);
    }

    /* incremental */
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned,   out_aligned);
    res &= chacha_test_multiblock_incremental(&key, &iv,   in_aligned, out_unaligned);
    if (input_buffer) {
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned,   out_aligned);
        res &= chacha_test_multiblock_incremental(&key, &iv, in_unaligned, out_unaligned);
    }

    /*
        hchacha
        key [192,193,194,..223], iv [16,17,18,..31]
    */
    for (i = 0; i < sizeof(h_key); i++) h_key[i] = (uint8_t)(i + 192);
    for (i = 0; i < sizeof(h_iv); i++) h_iv[i] = (uint8_t)(i + 16);

    memset(final_hchacha, 0, sizeof(final_hchacha));
    hchacha(h_key, h_iv, final_hchacha, chacha_test_rounds);
    res &= (memcmp(expected_hchacha, final_hchacha, sizeof(expected_hchacha)) == 0) ? 1 : 0;

    return res;
}